

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O3

void __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleInitializeRequest
          (cmDebuggerExceptionManager *this,CMakeInitializeResponse *response)

{
  CMakeInitializeResponse *pCVar1;
  mapped_type *pmVar2;
  _Hash_node_base *p_Var3;
  array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  ExceptionBreakpointsFilter filter;
  unique_lock<std::mutex> lock;
  vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  local_108;
  CMakeInitializeResponse *local_e8;
  undefined1 local_e0 [120];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  optional<dap::boolean> local_48;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->Mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  (response->supportsExceptionInfoRequest).val = true;
  (response->supportsExceptionInfoRequest).set = true;
  local_108.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (this->ExceptionMap)._M_h._M_before_begin._M_nxt;
  local_e8 = response;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_e0._0_8_ = local_e0 + 0x10;
      local_e0._8_8_ = 0;
      local_e0[0x10] = '\0';
      local_e0[0x20] = false;
      local_e0[0x28] = false;
      local_e0[0x29] = false;
      local_e0._48_8_ = local_e0 + 0x40;
      local_e0._56_8_ = 0;
      local_e0[0x40] = '\0';
      local_e0[0x50] = false;
      local_e0._96_8_ = 0;
      local_e0[0x68] = '\0';
      local_60 = 0;
      local_58._M_local_buf[0] = '\0';
      local_48.val.val = false;
      local_48.set = false;
      local_e0._88_8_ = local_e0 + 0x68;
      local_68._M_p = (pointer)&local_58;
      std::__cxx11::string::_M_assign((string *)(local_e0 + 0x58));
      std::__cxx11::string::_M_assign((string *)&local_68);
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->RaiseExceptions,(key_type *)(local_e0 + 0x58));
      local_e0[0x29] = true;
      local_e0[0x28] = *pmVar2;
      std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>::
      emplace_back<dap::ExceptionBreakpointsFilter&>
                ((vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>
                  *)&local_108,(ExceptionBreakpointsFilter *)local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,
                        CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1)
        ;
      }
      if ((undefined1 *)local_e0._88_8_ != local_e0 + 0x68) {
        operator_delete((void *)local_e0._88_8_,CONCAT71(local_e0._105_7_,local_e0[0x68]) + 1);
      }
      if ((undefined1 *)local_e0._48_8_ != local_e0 + 0x40) {
        operator_delete((void *)local_e0._48_8_,CONCAT71(local_e0._65_7_,local_e0[0x40]) + 1);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_,CONCAT71(local_e0._17_7_,local_e0[0x10]) + 1);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  pCVar1 = local_e8;
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  operator=(&(local_e8->exceptionBreakpointFilters).val,&local_108);
  (pCVar1->exceptionBreakpointFilters).set = true;
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  ~vector(&local_108);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void cmDebuggerExceptionManager::HandleInitializeRequest(
  dap::CMakeInitializeResponse& response)
{
  std::unique_lock<std::mutex> lock(Mutex);
  response.supportsExceptionInfoRequest = true;

  dap::array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  for (auto& pair : ExceptionMap) {
    dap::ExceptionBreakpointsFilter filter;
    filter.filter = pair.second.Filter;
    filter.label = pair.second.Label;
    filter.def = RaiseExceptions[filter.filter];
    exceptionBreakpointFilters.emplace_back(filter);
  }

  response.exceptionBreakpointFilters = exceptionBreakpointFilters;
}